

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  _Rb_tree_header *p_Var1;
  GoogleOnceDynamic *pGVar2;
  _Base_ptr p_Var3;
  OneofDescriptor *this_00;
  DebugStringOptions *debug_string_options_00;
  _Base_ptr p_Var4;
  FieldDescriptor *this_01;
  size_t sVar5;
  _Rb_tree_header *p_Var6;
  long lVar7;
  int depth_00;
  Descriptor *this_02;
  long lVar8;
  long lVar9;
  string prefix;
  SubstituteArg local_300;
  SubstituteArg local_2d0;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  DebugStringOptions *local_120;
  string local_118;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  SourceLocationCommentPrinter comment_printer;
  
  if (*(char *)(*(long *)(this + 0x20) + 0x6b) == '\0') {
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
    comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.leading_comments.field_2;
    comment_printer.source_loc_.leading_comments._M_string_length = 0;
    comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
    comment_printer.source_loc_.trailing_comments._M_string_length = 0;
    comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    comment_printer.options_.include_comments = debug_string_options->include_comments;
    comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
    comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
    comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment_printer.prefix_,prefix._M_dataplus._M_p,
               prefix._M_dataplus._M_p +
               CONCAT44(prefix._M_string_length._4_4_,(_Rb_tree_color)prefix._M_string_length));
    local_120 = debug_string_options;
    if (debug_string_options->include_comments == true) {
      comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
    }
    else {
      comment_printer.have_source_loc_ = false;
    }
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
    if (include_opening_clause) {
      groups._M_t._M_impl._0_8_ = prefix._M_dataplus._M_p;
      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)prefix._M_string_length;
      local_300.text_ = (char *)**(undefined8 **)this;
      local_300.size_ = *(int *)(*(undefined8 **)this + 1);
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      local_2d0.text_ = (char *)0x0;
      local_2d0.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0message $1",(SubstituteArg *)&groups,&local_300,&local_1e0,&local_180,
                 &local_150,&local_210,&local_240,&local_270,&local_2a0,&local_2d0);
    }
    std::__cxx11::string::append((char *)contents);
    depth_00 = depth + 1;
    anon_unknown_1::FormatLineOptions
              (depth_00,*(Message **)(this + 0x20),
               *(DescriptorPool **)(*(long *)(this + 0x10) + 0x10),contents);
    p_Var1 = &groups._M_t._M_impl.super__Rb_tree_header;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (0 < *(int *)(this + 0x2c)) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        lVar9 = *(long *)(this + 0x30);
        pGVar2 = *(GoogleOnceDynamic **)(lVar9 + 0x40 + lVar7);
        if (pGVar2 != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (pGVar2,FieldDescriptor::TypeOnceInit,(FieldDescriptor *)(lVar7 + lVar9));
        }
        if (*(int *)(lVar9 + 0x48 + lVar7) == 10) {
          lVar9 = *(long *)(this + 0x30);
          pGVar2 = *(GoogleOnceDynamic **)(lVar9 + 0x40 + lVar7);
          if (pGVar2 != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                      (pGVar2,FieldDescriptor::TypeOnceInit,(FieldDescriptor *)(lVar7 + lVar9));
          }
          local_300.text_ = *(char **)(lVar9 + 0x70 + lVar7);
          std::
          _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_insert_unique<google::protobuf::Descriptor_const*>
                    ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&groups,(Descriptor **)&local_300);
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0xa8;
      } while (lVar8 < *(int *)(this + 0x2c));
    }
    if (0 < *(int *)(this + 0x78)) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        lVar9 = *(long *)(this + 0x80);
        pGVar2 = *(GoogleOnceDynamic **)(lVar9 + 0x40 + lVar7);
        if (pGVar2 != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (pGVar2,FieldDescriptor::TypeOnceInit,(FieldDescriptor *)(lVar7 + lVar9));
        }
        if (*(int *)(lVar9 + 0x48 + lVar7) == 10) {
          lVar9 = *(long *)(this + 0x80);
          pGVar2 = *(GoogleOnceDynamic **)(lVar9 + 0x40 + lVar7);
          if (pGVar2 != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                      (pGVar2,FieldDescriptor::TypeOnceInit,(FieldDescriptor *)(lVar7 + lVar9));
          }
          local_300.text_ = *(char **)(lVar9 + 0x70 + lVar7);
          std::
          _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_insert_unique<google::protobuf::Descriptor_const*>
                    ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&groups,(Descriptor **)&local_300);
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0xa8;
      } while (lVar8 < *(int *)(this + 0x78));
    }
    debug_string_options_00 = local_120;
    if (0 < *(int *)(this + 0x48)) {
      lVar7 = 0;
      do {
        this_02 = (Descriptor *)(lVar7 * 0xa8 + *(long *)(this + 0x50));
        p_Var4 = &p_Var1->_M_header;
        for (p_Var3 = groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
            p_Var3 = (&p_Var3->_M_left)[*(Descriptor **)(p_Var3 + 1) < this_02]) {
          if (*(Descriptor **)(p_Var3 + 1) >= this_02) {
            p_Var4 = p_Var3;
          }
        }
        p_Var6 = p_Var1;
        if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
           (p_Var6 = (_Rb_tree_header *)p_Var4,
           this_02 < (Descriptor *)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
          p_Var6 = p_Var1;
        }
        if (p_Var6 == p_Var1) {
          DebugString(this_02,depth_00,contents,debug_string_options_00,true);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)(this + 0x48));
    }
    if (0 < *(int *)(this + 0x58)) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        EnumDescriptor::DebugString
                  ((EnumDescriptor *)(*(long *)(this + 0x60) + lVar7),depth_00,contents,
                   debug_string_options_00);
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x38;
      } while (lVar8 < *(int *)(this + 0x58));
    }
    if (0 < *(int *)(this + 0x2c)) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        this_00 = *(OneofDescriptor **)(*(long *)(this + 0x30) + 0x60 + lVar7);
        this_01 = (FieldDescriptor *)(*(long *)(this + 0x30) + lVar7);
        if (this_00 == (OneofDescriptor *)0x0) {
          FieldDescriptor::DebugString
                    (this_01,depth_00,PRINT_LABEL,contents,debug_string_options_00);
        }
        else if (this_01 == (FieldDescriptor *)**(long **)(this_00 + 0x20)) {
          OneofDescriptor::DebugString(this_00,depth_00,contents,debug_string_options_00);
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0xa8;
      } while (lVar8 < *(int *)(this + 0x2c));
    }
    if (0 < *(int *)(this + 0x68)) {
      lVar7 = 0;
      do {
        local_300.text_ = prefix._M_dataplus._M_p;
        local_300.size_ = (_Rb_tree_color)prefix._M_string_length;
        local_1e0.text_ =
             FastInt32ToBuffer(*(int32 *)(*(long *)(this + 0x70) + lVar7 * 8),local_1e0.scratch_);
        sVar5 = strlen(local_1e0.text_);
        local_1e0.size_ = (int)sVar5;
        local_180.text_ =
             FastInt32ToBuffer(*(int *)(*(long *)(this + 0x70) + 4 + lVar7 * 8) + -1,
                               local_180.scratch_);
        sVar5 = strlen(local_180.text_);
        local_180.size_ = (int)sVar5;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_2a0.text_ = (char *)0x0;
        local_2a0.size_ = -1;
        local_2d0.text_ = (char *)0x0;
        local_2d0.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  extensions $1 to $2;\n",&local_300,&local_1e0,&local_180,&local_150
                   ,&local_210,&local_240,&local_270,&local_2a0,&local_2d0,&local_1b0);
        lVar7 = lVar7 + 1;
      } while (lVar7 < *(int *)(this + 0x68));
    }
    if (0 < *(int *)(this + 0x78)) {
      lVar9 = 0;
      lVar8 = 0;
      lVar7 = 0;
      do {
        if (*(long *)(*(long *)(this + 0x80) + 0x58 + lVar9) != lVar7) {
          if (lVar9 != 0) {
            local_300.text_ = prefix._M_dataplus._M_p;
            local_300.size_ = (_Rb_tree_color)prefix._M_string_length;
            local_1e0.text_ = (char *)0x0;
            local_1e0.size_ = -1;
            local_180.text_ = (char *)0x0;
            local_180.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_210.text_ = (char *)0x0;
            local_210.size_ = -1;
            local_240.text_ = (char *)0x0;
            local_240.size_ = -1;
            local_270.text_ = (char *)0x0;
            local_270.size_ = -1;
            local_2a0.text_ = (char *)0x0;
            local_2a0.size_ = -1;
            local_2d0.text_ = (char *)0x0;
            local_2d0.size_ = -1;
            local_1b0.text_ = (char *)0x0;
            local_1b0.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0  }\n",&local_300,&local_1e0,&local_180,&local_150,&local_210,
                       &local_240,&local_270,&local_2a0,&local_2d0,&local_1b0);
          }
          lVar7 = *(long *)(*(long *)(this + 0x80) + 0x58 + lVar9);
          local_300.text_ = prefix._M_dataplus._M_p;
          local_300.size_ = (_Rb_tree_color)prefix._M_string_length;
          local_1e0.text_ = (char *)**(undefined8 **)(lVar7 + 8);
          local_1e0.size_ = *(int *)(*(undefined8 **)(lVar7 + 8) + 1);
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          local_210.text_ = (char *)0x0;
          local_210.size_ = -1;
          local_240.text_ = (char *)0x0;
          local_240.size_ = -1;
          local_270.text_ = (char *)0x0;
          local_270.size_ = -1;
          local_2a0.text_ = (char *)0x0;
          local_2a0.size_ = -1;
          local_2d0.text_ = (char *)0x0;
          local_2d0.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0  extend .$1 {\n",&local_300,&local_1e0,&local_180,&local_150,
                     &local_210,&local_240,&local_270,&local_2a0,&local_2d0,&local_1b0);
        }
        FieldDescriptor::DebugString
                  ((FieldDescriptor *)(*(long *)(this + 0x80) + lVar9),depth + 2,PRINT_LABEL,
                   contents,local_120);
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0xa8;
      } while (lVar8 < *(int *)(this + 0x78));
      if (0 < *(int *)(this + 0x78)) {
        local_300.text_ = prefix._M_dataplus._M_p;
        local_300.size_ = (_Rb_tree_color)prefix._M_string_length;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_2a0.text_ = (char *)0x0;
        local_2a0.size_ = -1;
        local_2d0.text_ = (char *)0x0;
        local_2d0.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  }\n",&local_300,&local_1e0,&local_180,&local_150,&local_210,
                   &local_240,&local_270,&local_2a0,&local_2d0,&local_1b0);
      }
    }
    if (0 < *(int *)(this + 0x88)) {
      local_300.text_ = prefix._M_dataplus._M_p;
      local_300.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      local_2d0.text_ = (char *)0x0;
      local_2d0.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_300,&local_1e0,&local_180,&local_150,&local_210,
                 &local_240,&local_270,&local_2a0,&local_2d0,&local_1b0);
      if (0 < *(int *)(this + 0x88)) {
        lVar7 = 0;
        do {
          lVar8 = *(long *)(this + 0x90);
          if (*(int *)(lVar8 + 4 + lVar7 * 8) == *(int *)(lVar8 + lVar7 * 8) + 1) {
            local_300.text_ = FastInt32ToBuffer(*(int32 *)(lVar8 + lVar7 * 8),local_300.scratch_);
            sVar5 = strlen(local_300.text_);
            local_300.size_ = (int)sVar5;
            local_1e0.text_ = (char *)0x0;
            local_1e0.size_ = -1;
            local_180.text_ = (char *)0x0;
            local_180.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_210.text_ = (char *)0x0;
            local_210.size_ = -1;
            local_240.text_ = (char *)0x0;
            local_240.size_ = -1;
            local_270.text_ = (char *)0x0;
            local_270.size_ = -1;
            local_2a0.text_ = (char *)0x0;
            local_2a0.size_ = -1;
            local_2d0.text_ = (char *)0x0;
            local_2d0.size_ = -1;
            local_1b0.text_ = (char *)0x0;
            local_1b0.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0, ",&local_300,&local_1e0,&local_180,&local_150,&local_210,
                       &local_240,&local_270,&local_2a0,&local_2d0,&local_1b0);
          }
          else {
            local_300.text_ = FastInt32ToBuffer(*(int32 *)(lVar8 + lVar7 * 8),local_300.scratch_);
            sVar5 = strlen(local_300.text_);
            local_300.size_ = (int)sVar5;
            local_1e0.text_ =
                 FastInt32ToBuffer(*(int *)(lVar8 + 4 + lVar7 * 8) + -1,local_1e0.scratch_);
            sVar5 = strlen(local_1e0.text_);
            local_1e0.size_ = (int)sVar5;
            local_180.text_ = (char *)0x0;
            local_180.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_210.text_ = (char *)0x0;
            local_210.size_ = -1;
            local_240.text_ = (char *)0x0;
            local_240.size_ = -1;
            local_270.text_ = (char *)0x0;
            local_270.size_ = -1;
            local_2a0.text_ = (char *)0x0;
            local_2a0.size_ = -1;
            local_2d0.text_ = (char *)0x0;
            local_2d0.size_ = -1;
            local_1b0.text_ = (char *)0x0;
            local_1b0.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0 to $1, ",&local_300,&local_1e0,&local_180,&local_150,&local_210,
                       &local_240,&local_270,&local_2a0,&local_2d0,&local_1b0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)(this + 0x88));
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x633386);
    }
    if (0 < *(int *)(this + 0x98)) {
      local_300.text_ = prefix._M_dataplus._M_p;
      local_300.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      local_2d0.text_ = (char *)0x0;
      local_2d0.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_300,&local_1e0,&local_180,&local_150,&local_210,
                 &local_240,&local_270,&local_2a0,&local_2d0,&local_1b0);
      if (0 < *(int *)(this + 0x98)) {
        lVar7 = 0;
        do {
          CEscape(&local_118,*(string **)(*(long *)(this + 0xa0) + lVar7 * 8));
          local_300.text_ = local_118._M_dataplus._M_p;
          local_300.size_ = (_Rb_tree_color)local_118._M_string_length;
          local_1e0.text_ = (char *)0x0;
          local_1e0.size_ = -1;
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          local_210.text_ = (char *)0x0;
          local_210.size_ = -1;
          local_240.text_ = (char *)0x0;
          local_240.size_ = -1;
          local_270.text_ = (char *)0x0;
          local_270.size_ = -1;
          local_2a0.text_ = (char *)0x0;
          local_2a0.size_ = -1;
          local_2d0.text_ = (char *)0x0;
          local_2d0.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"\"$0\", ",&local_300,&local_1e0,&local_180,&local_150,&local_210,
                     &local_240,&local_270,&local_2a0,&local_2d0,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)(this + 0x98));
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x633386);
    }
    local_300.text_ = prefix._M_dataplus._M_p;
    local_300.size_ = (_Rb_tree_color)prefix._M_string_length;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_270.text_ = (char *)0x0;
    local_270.size_ = -1;
    local_2a0.text_ = (char *)0x0;
    local_2a0.size_ = -1;
    local_2d0.text_ = (char *)0x0;
    local_2d0.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0}\n",&local_300,&local_1e0,&local_180,&local_150,&local_210,&local_240,
               &local_270,&local_2a0,&local_2d0,&local_1b0);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
    std::
    _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~_Rb_tree(&groups._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
      operator_delete(comment_printer.prefix_._M_dataplus._M_p,
                      comment_printer.prefix_.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&comment_printer.source_loc_.leading_detached_comments);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
        &comment_printer.source_loc_.trailing_comments.field_2) {
      operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p,
                      CONCAT71(comment_printer.source_loc_.trailing_comments.field_2.
                               _M_allocated_capacity._1_7_,
                               comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0]
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
        &comment_printer.source_loc_.leading_comments.field_2) {
      operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p,
                      CONCAT71(comment_printer.source_loc_.leading_comments.field_2.
                               _M_allocated_capacity._1_7_,
                               comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, string *contents,
                             const DebugStringOptions&
                             debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter
      comment_printer(this, prefix, debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    strings::SubstituteAndAppend(contents, "$0message $1", prefix, name());
  }
  contents->append(" {\n");

  FormatLineOptions(depth, options(), file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (groups.count(nested_type(i)) == 0) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->containing_oneof() == NULL) {
      field(i)->DebugString(depth, FieldDescriptor::PRINT_LABEL, contents,
                            debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    strings::SubstituteAndAppend(contents, "$0  extensions $1 to $2;\n",
                                 prefix,
                                 extension_range(i)->start,
                                 extension_range(i)->end - 1);
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) strings::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(contents, "$0  extend .$1 {\n",
                                   prefix, containing_type->full_name());
    }
    extension(i)->DebugString(
        depth + 1, FieldDescriptor::PRINT_LABEL, contents,
        debug_string_options);
  }
  if (extension_count() > 0)
    strings::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ",
                                     range->start, range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                   CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}